

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ApplyHandoffRemovesUnsupportedCiphers_Test::TestBody
          (SSLTest_ApplyHandoffRemovesUnsupportedCiphers_Test *this)

{
  bool bVar1;
  SSL_METHOD *meth;
  OPENSSL_STACK *pOVar2;
  AssertHelper *pAVar3;
  pointer *__ptr;
  long *plVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  Span<const_unsigned_char> handoff_00;
  AssertHelper local_108;
  AssertionResult gtest_ar__2;
  UniquePtr<SSL> server;
  AssertionResult gtest_ar_;
  AssertHelper local_c8;
  UniquePtr<SSL_CTX> server_ctx;
  uint8_t handoff [157];
  
  pAVar3 = &local_108;
  meth = (SSL_METHOD *)TLS_method();
  server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)handoff,(internal *)&gtest_ar_,(AssertionResult *)"server_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&server,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1902,(char *)handoff._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server);
    std::__cxx11::string::~string((string *)handoff);
    if (gtest_ar__2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00197bae;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 SSL_new((SSL_CTX *)
                         server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_st_*,_bssl::internal::Deleter>)
       server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl != (_Head_base<0UL,_ssl_st_*,_false>)0x0;
  if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
      server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl == (_Head_base<0UL,_ssl_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)handoff,(internal *)&gtest_ar_,(AssertionResult *)0x309a15,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1904,(char *)handoff._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)handoff);
    plVar4 = (long *)gtest_ar__2._0_8_;
LAB_00197b47:
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    memcpy(handoff,&DAT_002ee590,0x9d);
    local_108.data_._0_4_ = 1;
    pOVar2 = (OPENSSL_STACK *)
             SSL_get_ciphers((SSL *)server._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    gtest_ar__2._0_8_ = OPENSSL_sk_num(pOVar2);
    testing::internal::CmpHelperLT<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar_,"1u","sk_SSL_CIPHER_num(SSL_get_ciphers(server.get()))",
               (uint *)&local_108,(unsigned_long *)&gtest_ar__2);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      pAVar3 = (AssertHelper *)0x1922;
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1922,pcVar5);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&gtest_ar__2);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (gtest_ar__2._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    handoff_00.size_ = (size_t)pAVar3;
    handoff_00.data_ = (uchar *)0x9d;
    bVar1 = SSL_apply_handoff((bssl *)server._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                              (SSL *)handoff,handoff_00);
    this_00 = &gtest_ar__2.message_;
    gtest_ar__2.success_ = bVar1;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                 (AssertionResult *)
                 "SSL_apply_handoff(server.get(), {handoff, (sizeof(handoff) / sizeof((handoff)[0]))})"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1924,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      plVar4 = (long *)CONCAT44(local_108.data_._4_4_,local_108.data_._0_4_);
      goto LAB_00197b47;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    local_108.data_._0_4_ = 1;
    pOVar2 = (OPENSSL_STACK *)
             SSL_get_ciphers((SSL *)server._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    gtest_ar__2._0_8_ = OPENSSL_sk_num(pOVar2);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar_,"1u","sk_SSL_CIPHER_num(SSL_get_ciphers(server.get()))",
               (uint *)&local_108,(unsigned_long *)&gtest_ar__2);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1925,pcVar5);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&gtest_ar__2);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (gtest_ar__2._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
      }
    }
    this_00 = &gtest_ar_.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
LAB_00197bae:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx);
  return;
}

Assistant:

TEST(SSLTest, ApplyHandoffRemovesUnsupportedCiphers) {
  bssl::UniquePtr<SSL_CTX> server_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(server_ctx);
  bssl::UniquePtr<SSL> server(SSL_new(server_ctx.get()));
  ASSERT_TRUE(server);

  // handoff is a handoff message that has been artificially modified to pretend
  // that only TLS_ECDHE_RSA_WITH_AES_128_GCM_SHA256 (0xc02f) is supported. When
  // it is applied to |server|, all ciphers but that one should be removed.
  //
  // To make a new one of these, try sticking this in the |Handoff| test above:
  //
  // hexdump(stderr, "", handoff.data(), handoff.size());
  // sed -e 's/\(..\)/0x\1, /g'
  //
  // and modify serialize_features() to emit only cipher 0x0A.

  uint8_t handoff[] = {
      0x30, 0x81, 0x9a, 0x02, 0x01, 0x00, 0x04, 0x00, 0x04, 0x81, 0x82, 0x01,
      0x00, 0x00, 0x7e, 0x03, 0x03, 0x30, 0x8e, 0x8f, 0x79, 0xd2, 0x87, 0x39,
      0xc2, 0x23, 0x23, 0x13, 0xca, 0x3c, 0x80, 0x44, 0xfd, 0x80, 0x83, 0x62,
      0x3c, 0xcc, 0xf8, 0x76, 0xd3, 0x62, 0xbb, 0x54, 0xe3, 0xc4, 0x39, 0x24,
      0xa5, 0x00, 0x00, 0x1e, 0xc0, 0x2b, 0xc0, 0x2f, 0xc0, 0x2c, 0xc0, 0x30,
      0xcc, 0xa9, 0xcc, 0xa8, 0xc0, 0x09, 0xc0, 0x13, 0xc0, 0x0a, 0xc0, 0x14,
      0x00, 0x9c, 0x00, 0x9d, 0x00, 0x2f, 0x00, 0x35, 0x00, 0x0a, 0x01, 0x00,
      0x00, 0x37, 0x00, 0x17, 0x00, 0x00, 0xff, 0x01, 0x00, 0x01, 0x00, 0x00,
      0x0a, 0x00, 0x08, 0x00, 0x06, 0x00, 0x1d, 0x00, 0x17, 0x00, 0x18, 0x00,
      0x0b, 0x00, 0x02, 0x01, 0x00, 0x00, 0x23, 0x00, 0x00, 0x00, 0x0d, 0x00,
      0x14, 0x00, 0x12, 0x04, 0x03, 0x08, 0x04, 0x04, 0x01, 0x05, 0x03, 0x08,
      0x05, 0x05, 0x01, 0x08, 0x06, 0x06, 0x01, 0x02, 0x01, 0x04, 0x02, 0xc0,
      0x2f, 0x04, 0x0a, 0x00, 0x15, 0x00, 0x17, 0x00, 0x18, 0x00, 0x19, 0x00,
      0x1d,
  };

  EXPECT_LT(1u, sk_SSL_CIPHER_num(SSL_get_ciphers(server.get())));
  ASSERT_TRUE(
      SSL_apply_handoff(server.get(), {handoff, OPENSSL_ARRAY_SIZE(handoff)}));
  EXPECT_EQ(1u, sk_SSL_CIPHER_num(SSL_get_ciphers(server.get())));
}